

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::TimezoneFun::GetFunctions(void)

{
  pointer pSVar1;
  LogicalType varargs;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  long lVar2;
  pointer function_00;
  initializer_list<duckdb::LogicalType> __l;
  function_statistics_t in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc14;
  undefined4 in_stack_fffffffffffffc1c;
  undefined1 null_handling;
  undefined8 bind_lambda;
  undefined1 local_3b8 [48];
  LogicalType local_388;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_370;
  LogicalType local_358;
  scalar_function_t local_340;
  ScalarFunction function;
  ScalarFunction local_1f8;
  BaseScalarFunction local_d0;
  
  function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p =
       (pointer)0x0;
  function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::TimezoneOperator>
  ;
  function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.field_2.
  _M_allocated_capacity =
       (size_type)
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_string_length =
       (size_type)
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_3b8._8_8_ = 0;
  local_3b8._0_8_ =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::TimezoneOperator>;
  local_3b8._24_8_ =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3b8._16_8_ =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_340.super__Function_base._M_functor._8_8_ = 0;
  local_340.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::TimezoneOperator>;
  local_340._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_340.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
            (in_RDI,(duckdb *)&function,(scalar_function_t *)local_3b8,&local_340,
             (scalar_function_t *)DatePart::TimezoneOperator::PropagateStatistics<duckdb::date_t>,
             DatePart::TimezoneOperator::PropagateStatistics<duckdb::timestamp_t>,
             in_stack_fffffffffffffbf8);
  ::std::_Function_base::~_Function_base(&local_340.super__Function_base);
  ::std::_Function_base::~_Function_base((_Function_base *)local_3b8);
  ::std::_Function_base::~_Function_base((_Function_base *)&function);
  LogicalType::LogicalType((LogicalType *)local_3b8,INTERVAL);
  LogicalType::LogicalType((LogicalType *)(local_3b8 + 0x18),TIME_TZ);
  __l._M_len = 2;
  __l._M_array = (iterator)local_3b8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_370,__l,(allocator_type *)&local_340);
  LogicalType::LogicalType(&local_388,TIME_TZ);
  bind_lambda = (bind_lambda_function_t)0x0;
  null_handling = 0x44;
  LogicalType::LogicalType(&local_358,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_358;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffc14;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffc1c;
  ScalarFunction::ScalarFunction
            (&function,(vector<duckdb::LogicalType,_true> *)&local_370,&local_388,
             (scalar_function_t *)&stack0xfffffffffffffc28,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,null_handling,(bind_lambda_function_t)bind_lambda);
  LogicalType::~LogicalType(&local_358);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffc28);
  LogicalType::~LogicalType(&local_388);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_370);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_3b8 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  ScalarFunction::ScalarFunction(&local_1f8,&function);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_1f8);
  ScalarFunction::~ScalarFunction(&local_1f8);
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                     super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                     super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                     ._M_impl.super__Vector_impl_data._M_start; function_00 != pSVar1;
      function_00 = function_00 + 1) {
    BaseScalarFunction::SetReturnsError(&local_d0,&function_00->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&local_d0);
  }
  ScalarFunction::~ScalarFunction(&function);
  return in_RDI;
}

Assistant:

ScalarFunctionSet TimezoneFun::GetFunctions() {
	auto operator_set = GetDatePartFunction<DatePart::TimezoneOperator>();

	//	PG also defines timezone(INTERVAL, TIME_TZ) => TIME_TZ
	ScalarFunction function({LogicalType::INTERVAL, LogicalType::TIME_TZ}, LogicalType::TIME_TZ,
	                        DatePart::TimezoneOperator::BinaryFunction<interval_t, dtime_tz_t, dtime_tz_t>);

	operator_set.AddFunction(function);

	for (auto &func : operator_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}

	return operator_set;
}